

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::FilterCondition>::erase
          (QGenericArrayOps<QXdgDesktopPortalFileDialog::FilterCondition> *this,FilterCondition *b,
          qsizetype n)

{
  FilterCondition *pFVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  FilterCondition *__last;
  long lVar5;
  FilterCondition *end;
  FilterCondition *pFVar6;
  
  __last = b + n;
  pFVar1 = (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).ptr;
  lVar5 = (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size;
  pFVar6 = pFVar1 + lVar5;
  if (__last == pFVar6 || pFVar1 != b) {
    if (__last != pFVar6) {
      do {
        pFVar1 = b + n;
        b->type = pFVar1->type;
        pDVar2 = (b->pattern).d.d;
        (b->pattern).d.d = (pFVar1->pattern).d.d;
        (pFVar1->pattern).d.d = pDVar2;
        pcVar3 = (b->pattern).d.ptr;
        (b->pattern).d.ptr = (pFVar1->pattern).d.ptr;
        (pFVar1->pattern).d.ptr = pcVar3;
        qVar4 = (b->pattern).d.size;
        (b->pattern).d.size = (pFVar1->pattern).d.size;
        (pFVar1->pattern).d.size = qVar4;
        b = b + 1;
      } while (pFVar1 + 1 != pFVar6);
      lVar5 = (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size;
      __last = b + n;
    }
  }
  else {
    (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).ptr = __last;
  }
  (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size = lVar5 - n;
  std::_Destroy_aux<false>::__destroy<QXdgDesktopPortalFileDialog::FilterCondition*>(b,__last);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }